

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnJoin(RenX_LoggingPlugin *this,Server *server,PlayerInfo *player)

{
  char cVar1;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  if ((this->field_0xa0 & 8) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_38,&this->joinPublicFmt);
    if (local_38._M_string_length != 0) {
      RenX::processTags((string *)&local_38,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
      RenX::Server::sendPubChan(server,local_38._M_string_length,local_38._M_dataplus._M_p);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_38,&this->joinAdminFmt + (player->steamid == 0));
  if (local_38._M_string_length != 0) {
    cVar1 = RenX::Server::isMatchPending();
    if (cVar1 == '\0') {
      RenX::processTags((string *)&local_38,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
      RenX::Server::sendAdmChan(server,local_38._M_string_length,local_38._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player)
{
	std::string msg;
	if (RenX_LoggingPlugin::joinPublic)
	{
		msg = this->joinPublicFmt;
		if (!msg.empty())
		{
			RenX::processTags(msg, &server, &player);
			server.sendPubChan(msg);
		}
	}
	if (player.steamid == 0)
		msg = this->joinNoSteamAdminFmt;
	else
		msg = this->joinAdminFmt;

	if (!msg.empty() && server.isMatchPending() == false)
	{
		RenX::processTags(msg, &server, &player);
		server.sendAdmChan(msg);
	}
}